

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  pointer puVar1;
  bool bVar2;
  Edition EVar3;
  int iVar4;
  int iVar5;
  JavaType JVar6;
  MessageOptions *this_00;
  Options *pOVar7;
  FileDescriptor *pFVar8;
  size_type sVar9;
  OneofGeneratorInfo *args_1;
  FieldDescriptor *pFVar10;
  ImmutableFieldLiteGenerator *pIVar11;
  FieldDescriptor **__p;
  type ppFVar12;
  Descriptor *type;
  size_type sVar13;
  reference pvVar14;
  ulong uVar15;
  int index;
  iterator iVar16;
  string_view local_1e0;
  string_view local_1d0;
  string_view local_1c0;
  uint16_t local_1aa;
  ulong uStack_1a8;
  uint16_t code;
  size_t i_5;
  string line;
  string_view local_170;
  FieldDescriptor *local_160;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_150;
  int i_4;
  int local_144;
  undefined1 local_140 [4];
  int i_3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields_for_is_initialized_check;
  FieldDescriptor *field;
  int i_2;
  unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
  sorted_fields;
  int repeated_count;
  int map_count;
  string_view local_e8;
  uint local_d8;
  int local_d4;
  int i_1;
  int total_ints;
  int i;
  int total_bits;
  reference local_b8;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_a8;
  undefined1 local_a0 [8];
  iterator __end4;
  undefined1 local_80 [8];
  iterator __begin4;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range4;
  string_view local_58 [2];
  uint local_34;
  undefined1 local_30 [4];
  int flags;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  protobuf::io::Printer::Indent(printer);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  local_34 = 0;
  this_00 = Descriptor::options((this->super_MessageGenerator).descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    local_34 = local_34 | 2;
  }
  pOVar7 = Context::options(this->context_);
  if ((pOVar7->strip_nonfunctional_codegen & 1U) == 0) {
    pFVar8 = Descriptor::file((this->super_MessageGenerator).descriptor_);
    EVar3 = CodeGenerator::GetEdition(pFVar8);
    if (EVar3 == EDITION_PROTO2) {
      local_34 = local_34 | 1;
    }
    else {
      pFVar8 = Descriptor::file((this->super_MessageGenerator).descriptor_);
      EVar3 = CodeGenerator::GetEdition(pFVar8);
      if (999 < (int)EVar3) {
        local_34 = local_34 | 4;
      }
    }
  }
  WriteIntToUtf16CharSequence
            (local_34,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
  WriteIntToUtf16CharSequence
            (iVar4,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
  puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_58,"java.lang.Object[] objects = null;\n");
    protobuf::io::Printer::Print<>((Printer *)puVar1,local_58[0]);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range4,
               "java.lang.Object[] objects = new java.lang.Object[] {\n");
    protobuf::io::Printer::Print<>((Printer *)puVar1,___range4);
    protobuf::io::Printer::Indent
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    sVar9 = absl::lts_20250127::container_internal::
            btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
            ::size((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                    *)&(this->super_MessageGenerator).oneofs_);
    WriteIntToUtf16CharSequence
              ((int)sVar9,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    __begin4._8_8_ = &(this->super_MessageGenerator).oneofs_;
    iVar16 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
             ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                      *)__begin4._8_8_);
    __end4._8_8_ = iVar16.node_;
    __begin4.node_._0_4_ = iVar16.position_;
    local_80 = (undefined1  [8])__end4._8_8_;
    iVar16 = absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
             ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                    *)__begin4._8_8_);
    kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar16.node_;
    local_a8 = iVar16.position_;
    local_a0 = (undefined1  [8])kv;
    __end4.node_._0_4_ = local_a8;
    while (bVar2 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                 *)local_80,(iterator *)local_a0), bVar2) {
      local_b8 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)local_80);
      puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&i,
                 "\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n");
      args_1 = Context::GetOneofGeneratorInfo(this->context_,local_b8->second);
      protobuf::io::Printer::Print<char[11],std::__cxx11::string>
                ((Printer *)puVar1,_i,(char (*) [11])0x1f94809,&args_1->name);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                    *)local_80);
    }
    total_ints = 0;
    for (i_1 = 0; iVar4 = i_1,
        iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar5;
        i_1 = i_1 + 1) {
      pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,i_1);
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,pFVar10);
      iVar4 = (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[3])();
      total_ints = iVar4 + total_ints;
    }
    local_d4 = (total_ints + 0x1f) / 0x20;
    for (local_d8 = 0;
        puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, (int)local_d8 < local_d4;
        local_d8 = local_d8 + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,"\"$bit_field_name$\",\n");
      GetBitFieldName_abi_cxx11_((string *)&repeated_count,(java *)(ulong)local_d8,index);
      protobuf::io::Printer::Print<char[15],std::__cxx11::string>
                ((Printer *)puVar1,local_e8,(char (*) [15])"bit_field_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &repeated_count);
      std::__cxx11::string::~string((string *)&repeated_count);
    }
    WriteIntToUtf16CharSequence
              (local_d4,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._4_4_ = 0
    ;
    sorted_fields._M_t.
    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._0_4_ = 0
    ;
    __p = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    std::
    unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
    ::
    unique_ptr<google::protobuf::FieldDescriptor_const**,std::default_delete<google::protobuf::FieldDescriptor_const*[]>,void,bool>
              ((unique_ptr<google::protobuf::FieldDescriptor_const*[],std::default_delete<google::protobuf::FieldDescriptor_const*[]>>
                *)&stack0xfffffffffffffee8,__p);
    for (field._4_4_ = 0;
        iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
        field._4_4_ < iVar4; field._4_4_ = field._4_4_ + 1) {
      ppFVar12 = std::
                 unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                               *)&stack0xfffffffffffffee8,(long)field._4_4_);
      fields_for_is_initialized_check.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppFVar12;
      bVar2 = FieldDescriptor::is_map
                        ((FieldDescriptor *)
                         fields_for_is_initialized_check.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        sorted_fields._M_t.
        super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
        .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl._4_4_
             = sorted_fields._M_t.
               super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
               _M_head_impl._4_4_ + 1;
      }
      else {
        bVar2 = FieldDescriptor::is_repeated
                          ((FieldDescriptor *)
                           fields_for_is_initialized_check.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          sorted_fields._M_t.
          super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
          .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>._M_head_impl.
          _0_4_ = (int)sorted_fields._M_t.
                       super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                       .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                       _M_head_impl + 1;
        }
      }
    }
    ppFVar12 = std::
               unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                             *)&stack0xfffffffffffffee8,0);
    iVar4 = FieldDescriptor::number(*ppFVar12);
    WriteIntToUtf16CharSequence
              (iVar4,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    ppFVar12 = std::
               unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                             *)&stack0xfffffffffffffee8,(long)(iVar4 + -1));
    iVar4 = FieldDescriptor::number(*ppFVar12);
    WriteIntToUtf16CharSequence
              (iVar4,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_);
    WriteIntToUtf16CharSequence
              (iVar4,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    WriteIntToUtf16CharSequence
              (sorted_fields._M_t.
               super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
               .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
               _M_head_impl._4_4_,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    WriteIntToUtf16CharSequence
              ((int)sorted_fields._M_t.
                    super___uniq_ptr_impl<const_google::protobuf::FieldDescriptor_*,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_google::protobuf::FieldDescriptor_**,_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                    .super__Head_base<0UL,_const_google::protobuf::FieldDescriptor_**,_false>.
                    _M_head_impl,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30
              );
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_140);
    for (local_144 = 0; iVar4 = local_144,
        iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar5;
        local_144 = local_144 + 1) {
      pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_144);
      bVar2 = FieldDescriptor::is_required(pFVar10);
      if (bVar2) {
LAB_0180f866:
        pFStack_150 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_144);
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_140,&stack0xfffffffffffffeb0);
      }
      else {
        pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_144);
        JVar6 = GetJavaType(pFVar10);
        if (JVar6 == JAVATYPE_MESSAGE) {
          pFVar10 = Descriptor::field((this->super_MessageGenerator).descriptor_,local_144);
          type = FieldDescriptor::message_type(pFVar10);
          bVar2 = HasRequiredFields(type);
          if (bVar2) goto LAB_0180f866;
        }
      }
    }
    sVar13 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)local_140);
    WriteIntToUtf16CharSequence
              ((int)sVar13,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
    for (field_1._4_4_ = 0; iVar4 = field_1._4_4_,
        iVar5 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar5;
        field_1._4_4_ = field_1._4_4_ + 1) {
      ppFVar12 = std::
                 unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                 ::operator[]((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                               *)&stack0xfffffffffffffee8,(long)field_1._4_4_);
      local_160 = *ppFVar12;
      pIVar11 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                get(&this->field_generators_,local_160);
      (*(pIVar11->super_FieldGenerator)._vptr_FieldGenerator[8])
                (pIVar11,chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,local_30);
    }
    protobuf::io::Printer::Outdent
              ((Printer *)
               chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_170,"};\n");
    protobuf::io::Printer::Print<>((Printer *)puVar1,local_170);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_140);
    std::
    unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
    ::~unique_ptr((unique_ptr<const_google::protobuf::FieldDescriptor_*[],_std::default_delete<const_google::protobuf::FieldDescriptor_*[]>_>
                   *)&stack0xfffffffffffffee8);
  }
  puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&line.field_2 + 8),
             "java.lang.String info =\n");
  protobuf::io::Printer::Print<>((Printer *)puVar1,stack0xfffffffffffffe80);
  std::__cxx11::string::string((string *)&i_5);
  for (uStack_1a8 = 0; uVar15 = uStack_1a8,
      sVar13 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30),
      puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage, uVar15 < sVar13;
      uStack_1a8 = uStack_1a8 + 1) {
    pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30,
                         uStack_1a8);
    local_1aa = *pvVar14;
    EscapeUtf16ToString(local_1aa,(string *)&i_5);
    uVar15 = std::__cxx11::string::size();
    puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (0x4f < uVar15) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_1c0,"    \"$string$\" +\n");
      protobuf::io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)puVar1,local_1c0,(char (*) [7])0x1eb1fed,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
      std::__cxx11::string::clear();
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1d0,"    \"$string$\";\n");
  protobuf::io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)puVar1,local_1d0,(char (*) [7])0x1eb1fed,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
  puVar1 = chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1e0,"return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  protobuf::io::Printer::Print<>((Printer *)puVar1,local_1e0);
  protobuf::io::Printer::Outdent
            ((Printer *)
             chars.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&i_5);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_30);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  if (!context_->options().strip_nonfunctional_codegen) {
    if (JavaGenerator::GetEdition(*descriptor_->file()) ==
        Edition::EDITION_PROTO2) {
      flags |= 0x1;
    } else if (JavaGenerator::GetEdition(*descriptor_->file()) >=
               Edition::EDITION_2023) {
      flags |= 0x4;
    }
  }

  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;\n");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto& kv : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}